

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_SetSoundPaused(int state)

{
  undefined8 uVar1;
  int state_local;
  
  if (state == 0) {
    if ((paused == 0) && (S_PauseSound(false,true), GSnd != (SoundRenderer *)0x0)) {
      uVar1 = 2;
      if (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL) {
        uVar1 = 1;
      }
      (*GSnd->_vptr_SoundRenderer[0x17])(GSnd,uVar1);
    }
  }
  else if ((paused == 0) && (S_ResumeSound(true), GSnd != (SoundRenderer *)0x0)) {
    (*GSnd->_vptr_SoundRenderer[0x17])(GSnd,0);
  }
  if (((netgame & 1U) == 0) && ((demoplayback & 1U) == 0)) {
    pauseext = (bool)((state != 0 ^ 0xffU) & 1);
  }
  return;
}

Assistant:

void S_SetSoundPaused (int state)
{
	if (state)
	{
		if (paused == 0)
		{
			S_ResumeSound(true);
			if (GSnd != NULL)
			{
				GSnd->SetInactive(SoundRenderer::INACTIVE_Active);
			}
		}
	}
	else
	{
		if (paused == 0)
		{
			S_PauseSound(false, true);
			if (GSnd !=  NULL)
			{
				GSnd->SetInactive(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL ?
					SoundRenderer::INACTIVE_Complete :
					SoundRenderer::INACTIVE_Mute);
			}
		}
	}
	if (!netgame
#ifdef _DEBUG
		&& !demoplayback
#endif
		)
	{
		pauseext = !state;
	}
}